

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall ON_MeshFace::ComputeFaceNormal(ON_MeshFace *this,ON_3fPoint *fV,ON_3dVector *FN)

{
  bool bVar1;
  ON_3fVector OVar2;
  ON_3dVector local_b0;
  ON_3fVector local_98;
  ON_3fVector local_84;
  undefined1 local_78 [8];
  ON_3dVector b;
  float local_58;
  double local_50;
  float local_48;
  undefined1 local_40 [8];
  ON_3dVector a;
  ON_3dVector *FN_local;
  ON_3fPoint *fV_local;
  ON_MeshFace *this_local;
  
  a.z = (double)FN;
  if (fV != (ON_3fPoint *)0x0) {
    join_0x00001240_0x00001200_ = ON_3fPoint::operator-(fV + this->vi[2],fV + this->vi[0]);
    local_48 = local_58;
    local_50 = b.z;
    ON_3dVector::ON_3dVector((ON_3dVector *)local_40,(ON_3fVector *)&local_50);
    OVar2 = ON_3fPoint::operator-(fV + this->vi[3],fV + this->vi[1]);
    local_98._0_8_ = OVar2._0_8_;
    local_84.x = local_98.x;
    local_84.y = local_98.y;
    local_98.z = OVar2.z;
    local_84.z = local_98.z;
    local_98 = OVar2;
    ON_3dVector::ON_3dVector((ON_3dVector *)local_78,&local_84);
    ON_CrossProduct(&local_b0,(ON_3dVector *)local_40,(ON_3dVector *)local_78);
    *(double *)a.z = local_b0.x;
    *(double *)((long)a.z + 8) = local_b0.y;
    *(double *)((long)a.z + 0x10) = local_b0.z;
    bVar1 = ON_3dVector::Unitize((ON_3dVector *)a.z);
    if (bVar1) {
      return true;
    }
  }
  *(double *)a.z = ON_3dVector::ZeroVector.x;
  *(double *)((long)a.z + 8) = ON_3dVector::ZeroVector.y;
  *(double *)((long)a.z + 0x10) = ON_3dVector::ZeroVector.z;
  return false;
}

Assistant:

bool ON_MeshFace::ComputeFaceNormal( const ON_3fPoint* fV, ON_3dVector& FN ) const
{
  if ( 0 != fV )
  {
    ON_3dVector a = fV[vi[2]] - fV[vi[0]];
    ON_3dVector b = fV[vi[3]] - fV[vi[1]];
    FN = ON_CrossProduct( a, b ); // works for triangles, quads, and nonplanar quads
    if ( FN.Unitize() )
      return true;
  }

  FN = ON_3dVector::ZeroVector;
  return false;
}